

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O3

int ptls_load_certificates(ptls_context_t *ctx,char *cert_pem_file)

{
  int iVar1;
  ptls_iovec_t *list;
  
  list = (ptls_iovec_t *)malloc(0x100);
  (ctx->certificates).list = list;
  if (list != (ptls_iovec_t *)0x0) {
    iVar1 = ptls_load_pem_objects(cert_pem_file,"CERTIFICATE",list,0x10,&(ctx->certificates).count);
    return iVar1;
  }
  return 0x201;
}

Assistant:

int ptls_load_certificates(ptls_context_t *ctx, char const *cert_pem_file)
{
    int ret = 0;

    ctx->certificates.list = (ptls_iovec_t *)malloc(PTLS_MAX_CERTS_IN_CONTEXT * sizeof(ptls_iovec_t));

    if (ctx->certificates.list == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
    } else {
        ret = ptls_load_pem_objects(cert_pem_file, "CERTIFICATE", ctx->certificates.list, PTLS_MAX_CERTS_IN_CONTEXT,
                                    &ctx->certificates.count);
    }

    return ret;
}